

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O0

void formatter_suite::fail_u32string(void)

{
  basic_variable<std::allocator<char>_> *data_00;
  error *ex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,L"alpha");
  trial::protocol::json::format<std::__cxx11::string,std::allocator<char>>
            (&local_58,(json *)local_38,data_00);
  std::__cxx11::string::~string((string *)&local_58);
  trial::protocol::core::detail::throw_failed_impl
            ("json::format<std::string>(data)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x7c,"void formatter_suite::fail_u32string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void fail_u32string()
{
    variable data(U"alpha");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::format<std::string>(data),
                                    json::error,
                                    "incompatible type");
}